

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O0

Torsion * __thiscall OpenMD::SelectionManager::beginUnselectedTorsion(SelectionManager *this,int *i)

{
  int iVar1;
  reference ppTVar2;
  int *in_RSI;
  long in_RDI;
  OpenMDBitSet *in_stack_ffffffffffffffe0;
  value_type pTVar3;
  
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
            ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)(in_RDI + 8),3);
  iVar1 = OpenMDBitSet::firstOffBit(in_stack_ffffffffffffffe0);
  *in_RSI = iVar1;
  if (*in_RSI == -1) {
    pTVar3 = (value_type)0x0;
  }
  else {
    ppTVar2 = std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::operator[]
                        ((vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *)
                         (in_RDI + 0x80),(long)*in_RSI);
    pTVar3 = *ppTVar2;
  }
  return pTVar3;
}

Assistant:

Torsion* SelectionManager::beginUnselectedTorsion(int& i) {
#ifdef IS_MPI
    i = 0;
    while (i < static_cast<int>(ss_.bitsets_[TORSION].size())) {
      if (!ss_.bitsets_[TORSION][i]) {
        // check that this processor owns this torsion
        if (torsions_[i] != NULL) return torsions_[i];
      }
      ++i;
    }
    return NULL;
#else
    i = ss_.bitsets_[TORSION].firstOffBit();
    return i == -1 ? NULL : torsions_[i];
#endif
  }